

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexMatchAll
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  undefined8 name;
  bool bVar1;
  const_reference __rhs;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  allocator local_251;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  string e_1;
  size_type r;
  size_type l;
  char *p;
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_178 [8];
  string input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_130 [8];
  string e;
  undefined1 local_100 [8];
  RegularExpression re;
  string *outvar;
  string *regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,2);
  re._200_8_ = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,3);
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_100);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_100,pcVar2);
  if (bVar1) {
    local_198 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          (args);
    local_188 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::advance(&local_198,4);
    std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_178,&local_188,(string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&p);
    l = std::__cxx11::string::c_str();
    while( true ) {
      bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_100,(char *)l);
      name = re._200_8_;
      if (!bVar1) break;
      cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
      cmMakefile::StoreMatches((this->super_cmCommand).Makefile,(RegularExpression *)local_100);
      sVar3 = cmsys::RegularExpression::start((RegularExpression *)local_100);
      e_1.field_2._8_8_ = cmsys::RegularExpression::end((RegularExpression *)local_100);
      if (e_1.field_2._8_8_ == sVar3) {
        std::operator+(&local_230,"sub-command REGEX, mode MATCHALL regex \"",__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_210,&local_230,"\" matched an empty string.");
        std::__cxx11::string::~string((string *)&local_230);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_210);
        this_local._7_1_ = false;
        input.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_210);
        goto LAB_0030f32a;
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&p,";");
      }
      uVar4 = e_1.field_2._8_8_ - sVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,(char *)(l + sVar3),uVar4,&local_251);
      std::__cxx11::string::operator+=((string *)&p,local_250);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      l = e_1.field_2._8_8_ + l;
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,(string *)name,pcVar2);
    this_local._7_1_ = true;
    input.field_2._12_4_ = 1;
LAB_0030f32a:
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_178);
  }
  else {
    std::operator+(&local_150,"sub-command REGEX, mode MATCHALL failed to compile regex \"",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                   &local_150,"\".");
    std::__cxx11::string::~string((string *)&local_150);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_130);
    this_local._7_1_ = false;
    input.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_130);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_100);
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexMatchAll(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCHALL <regular_expression> <output variable> <input>
  // [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCHALL failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  const char* p = input.c_str();
  while (re.find(p)) {
    this->Makefile->ClearMatches();
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCHALL regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    if (!output.empty()) {
      output += ";";
    }
    output += std::string(p + l, r - l);
    p += r;
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}